

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mul.h
# Opt level: O3

LinTerms * __thiscall
mp::
QCConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_-1>
::LinearizeQPTerm(LinTerms *__return_storage_ptr__,
                 QCConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,__1>
                 *this,double c,int x,int y)

{
  double dVar1;
  double dVar2;
  FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *pFVar3;
  pointer pdVar4;
  pointer pdVar5;
  bool bVar6;
  bool bVar7;
  
  pFVar3 = (this->
           super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           ).mdl_cvt_;
  pdVar4 = (pFVar3->
           super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           ).
           super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           .super_FlatModel<mp::DefaultFlatModelParams>.var_lb_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar5 = (pFVar3->
           super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           ).
           super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           .super_FlatModel<mp::DefaultFlatModelParams>.var_ub_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  dVar1 = pdVar4[x];
  dVar2 = pdVar5[x];
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    if ((dVar1 == 1.0) && (!NAN(dVar1))) goto LAB_00183b6e;
LAB_00183b76:
    dVar1 = pdVar4[y];
    dVar2 = pdVar5[y];
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      if ((dVar1 == 1.0) && (!NAN(dVar1))) goto LAB_00183bc1;
    }
    else {
      if ((dVar2 != 1.0) || (NAN(dVar2))) {
LAB_00183bc1:
        bVar6 = NAN(dVar1) || NAN(dVar2);
        bVar7 = dVar1 == dVar2;
      }
      else {
        if ((pFVar3->
            super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            ).
            super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            .super_FlatModel<mp::DefaultFlatModelParams>.var_type_.
            super__Vector_base<mp::var::Type,_std::allocator<mp::var::Type>_>._M_impl.
            super__Vector_impl_data._M_start[y] == INTEGER) goto LAB_00183bc9;
        bVar6 = NAN(dVar1);
        bVar7 = dVar1 == 1.0;
      }
      if ((bVar7) && (!bVar6)) goto LAB_00183bc9;
    }
    LinearizeGeneralProduct(__return_storage_ptr__,this,c,x,y);
  }
  else {
    if ((dVar2 != 1.0) || (NAN(dVar2))) {
LAB_00183b6e:
      bVar6 = NAN(dVar1) || NAN(dVar2);
      bVar7 = dVar1 == dVar2;
LAB_00183b72:
      if ((!bVar7) || (bVar6)) goto LAB_00183b76;
    }
    else if ((pFVar3->
             super_MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             ).
             super_FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             .super_FlatModel<mp::DefaultFlatModelParams>.var_type_.
             super__Vector_base<mp::var::Type,_std::allocator<mp::var::Type>_>._M_impl.
             super__Vector_impl_data._M_start[x] != INTEGER) {
      bVar6 = NAN(dVar1);
      bVar7 = dVar1 == 1.0;
      goto LAB_00183b72;
    }
LAB_00183bc9:
    LinearizeProductWithBinaryVar(__return_storage_ptr__,this,c,x,y);
  }
  return __return_storage_ptr__;
}

Assistant:

LinTerms LinearizeQPTerm(double c, int x, int y) {
    if (GetMC().is_binary_var(x) ||
        GetMC().is_binary_var(y))
      return LinearizeProductWithBinaryVar(c, x, y);
    return LinearizeGeneralProduct(c, x, y);
  }